

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O3

int XPMPChangePlaneModel(XPMPPlaneID _id,char *inICAO,char *inAirline,char *inLivery)

{
  int iVar1;
  Aircraft *this;
  size_t sVar2;
  char *__s;
  string local_90;
  string local_70;
  string local_50;
  
  this = XPMP2::AcFindByID(0);
  if (this == (Aircraft *)0x0) {
    iVar1 = -1;
  }
  else {
    if (inICAO == (char *)0x0) {
      inICAO = "";
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar2 = strlen(inICAO);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,inICAO,inICAO + sVar2);
    if (inAirline == (char *)0x0) {
      inAirline = "";
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    sVar2 = strlen(inAirline);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,inAirline,inAirline + sVar2)
    ;
    __s = "";
    if (inLivery != (char *)0x0) {
      __s = inLivery;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar2);
    iVar1 = XPMP2::Aircraft::ChangeModel(this,&local_50,&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar1;
}

Assistant:

int     XPMPChangePlaneModel(XPMPPlaneID            _id,
                             const char *           inICAO,
                             const char *           inAirline,
                             const char *           inLivery)
{
    Aircraft* pAc = AcFindByID(_id);
    if (pAc)
        return pAc->ChangeModel(inICAO      ? inICAO : "",
                                inAirline   ? inAirline : "",
                                inLivery    ? inLivery : "");
    else
        return -1;
}